

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

bool __thiscall ServerManager::freeServer(ServerManager *this,string_view serverConfig)

{
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *puVar1;
  bool bVar2;
  const_iterator __position;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  __position._M_current =
       (this->m_servers).
       super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar1 = (this->m_servers).
             super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current == puVar1) {
LAB_001130af:
      return __position._M_current != puVar1;
    }
    lhs = (basic_string_view<char,_std::char_traits<char>_>)Jupiter::IRC::Client::getConfigSection()
    ;
    bVar2 = jessilib::equalsi<char,char>(lhs,serverConfig);
    if (bVar2) {
      std::
      vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
      ::erase(&this->m_servers,__position);
      goto LAB_001130af;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

bool ServerManager::freeServer(std::string_view serverConfig) {
	for (auto itr = m_servers.begin(); itr != m_servers.end(); ++itr) {
		if (jessilib::equalsi((*itr)->getConfigSection(), serverConfig)) {
			m_servers.erase(itr);
			return true;
		}
	}

	return false;
}